

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilitySelector.hpp
# Opt level: O0

Status __thiscall
AO::BehaviorTree::Version_1::Details::ProbabilitySelector<Agent,_short>::execute
          (ProbabilitySelector<Agent,_short> *this,EntityPtr entity,short args)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference this_00;
  element_type *peVar4;
  result_type_conflict rVar5;
  Status status_1;
  pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float>
  *weighting;
  iterator __end0;
  iterator __begin0;
  WeightingMap *__range5;
  float sum;
  float chosen;
  uniform_real_distribution<float> distribution;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  Status local_23;
  short local_22;
  Status status;
  EntityPtr pEStack_20;
  short args_local;
  EntityPtr entity_local;
  ProbabilitySelector<Agent,_short> *this_local;
  
  local_22 = args;
  pEStack_20 = entity;
  entity_local = (EntityPtr)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->currentNode);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->currentNode);
    iVar2 = (*(peVar4->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                      (peVar4,pEStack_20,(ulong)(uint)(int)local_22);
    local_23 = (Status)iVar2;
    if (local_23 != Running) {
      std::
      __shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
      ::reset(&(this->currentNode).
               super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
             );
    }
    this_local._7_1_ = local_23;
  }
  else {
    if ((ProbabilitySelector<Agent,short>::execute(Agent*,short)::generator == '\0') &&
       (iVar2 = __cxa_guard_acquire(&ProbabilitySelector<Agent,short>::execute(Agent*,short)::
                                     generator), iVar2 != 0)) {
      local_38.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_30.__r = (rep)std::chrono::
                          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          ::time_since_epoch(&local_38);
      uVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_30);
      std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
      linear_congruential_engine(&execute::generator,uVar3 & 0xffffffff);
      __cxa_guard_release(&ProbabilitySelector<Agent,short>::execute(Agent*,short)::generator);
    }
    std::uniform_real_distribution<float>::uniform_real_distribution
              ((uniform_real_distribution<float> *)&sum,0.0,this->totalSum);
    rVar5 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&sum,&execute::generator);
    __range5._4_4_ = 0.0;
    __end0 = std::
             unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float>_>_>
             ::begin(&this->weightingMap);
    weighting = (pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float>
                 *)std::
                   unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float>_>_>
                   ::end(&this->weightingMap);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end0.
                          super__Node_iterator_base<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float>,_false>
                         ,(_Node_iterator_base<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float>,_false>
                           *)&weighting);
      if (!bVar1) {
        __assert_fail("!\"Weighting is too high\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herpec-j[P]BehaviorTree//BehaviorTree/Includes/BehaviorTree/Details/ProbabilitySelector.hpp"
                      ,0x54,
                      "virtual Status AO::BehaviorTree::Details::ProbabilitySelector<Agent, short>::execute(EntityPtr, Args...) [Entity = Agent, Args = <short>]"
                     );
      }
      this_00 = std::__detail::
                _Node_iterator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float>,_false,_false>
                ::operator*(&__end0);
      __range5._4_4_ = this_00->second + __range5._4_4_;
      if (rVar5 <= __range5._4_4_) break;
      std::__detail::
      _Node_iterator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_float>,_false,_false>
      ::operator++(&__end0);
    }
    peVar4 = std::
             __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
    iVar2 = (*(peVar4->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                      (peVar4,pEStack_20,(ulong)(uint)(int)local_22);
    this_local._7_1_ = (Status)iVar2;
    if (this_local._7_1_ == Running) {
      std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>::operator=
                (&this->currentNode,&this_00->first);
    }
  }
  return this_local._7_1_;
}

Assistant:

Status execute(EntityPtr entity, Args... args) override final
					{
						if (currentNode)
						{
							Status const status = currentNode->execute(entity, args...);
							if (status != Status::Running)
							{
								currentNode.reset();
							}
							return status;
						}
						else
						{
							static std::default_random_engine generator(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
							std::uniform_real_distribution<float> distribution(0.0f, totalSum);
							float const chosen = distribution(generator);
							float sum = 0.0f;
							for (auto &weighting : weightingMap)
							{
								sum += weighting.second;
								if (sum >= chosen)
								{
									Status const status = weighting.first->execute(entity, args...);
									if (status == Status::Running)
									{
										currentNode = weighting.first;
									}
									return status;
								}
							}
							assert(!"Weighting is too high");
							return Status::Failure;
						}
					}